

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_HexStr::test_method(util_HexStr *this)

{
  long lVar1;
  Span<const_unsigned_char> s;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  string *psVar3;
  iterator pvVar4;
  size_t i;
  long lVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string file;
  Span<const_unsigned_char> s_00;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_01;
  const_string file_03;
  Span<const_unsigned_char> s_02;
  const_string file_04;
  Span<const_unsigned_char> s_03;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  check_type cVar6;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  size_type lower;
  size_type upper;
  ulong local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  string_view out_exp;
  assertion_result local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
  local_88;
  string hex;
  string input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xed;
  file.m_begin = (iterator)&local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0 = "";
  s_00.m_size = 0x41;
  s_00.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&hex,s_00);
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[131]>
            (&input,&local_b8,0xed,1,2,psVar3,"HexStr(HEX_PARSE_OUTPUT)",HEX_PARSE_INPUT,
             "HEX_PARSE_INPUT");
  std::__cxx11::string::~string((string *)&hex);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0xee;
  file_00.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e0 = "";
  HexStr_abi_cxx11_(&hex,(Span<const_unsigned_char>)ZEXT816(0xc71241));
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&input,&local_e8,0xee,1,2,psVar3,"HexStr(Span{HEX_PARSE_OUTPUT}.last(0))","","\"\"");
  std::__cxx11::string::~string((string *)&hex);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0xef;
  file_01.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_110 = "";
  HexStr_abi_cxx11_(&hex,(Span<const_unsigned_char>)ZEXT816(0xc71200));
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&input,&local_118,0xef,1,2,psVar3,"HexStr(Span{HEX_PARSE_OUTPUT}.first(0))","","\"\"");
  std::__cxx11::string::~string((string *)&hex);
  out_exp._M_len = 10;
  out_exp._M_str = "04678afdb0";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0xf7;
  file_02.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = "";
  s_01.m_size = 5;
  s_01.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&hex,s_01);
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
            (&input,&local_148,0xf7,1,2,psVar3,"HexStr(in_u)",&out_exp,"out_exp");
  std::__cxx11::string::~string((string *)&hex);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0xf8;
  file_03.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_170 = "";
  s_02.m_size = 5;
  s_02.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&hex,s_02);
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
            (&input,&local_178,0xf8,1,2,psVar3,"HexStr(in_s)",&out_exp,"out_exp");
  std::__cxx11::string::~string((string *)&hex);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0xf9;
  file_04.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  input._M_string_length._0_1_ = 0;
  input._M_dataplus._M_p = "<W\x1b";
  input.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  s_03.m_size = 5;
  s_03.m_data = HEX_PARSE_OUTPUT;
  HexStr_abi_cxx11_(&hex,s_03);
  pvVar2 = (iterator)0x2;
  psVar3 = &hex;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
            (&input,&local_1a8,0xf9,1,2,psVar3,"HexStr(in_b)",&out_exp,"out_exp");
  std::__cxx11::string::~string((string *)&hex);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length._0_1_ = 0;
  input._M_string_length._1_7_ = 0;
  input.field_2._M_allocated_capacity = input.field_2._M_allocated_capacity & 0xffffffffffffff00;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&input,(char)lVar5);
  }
  s.m_size._0_1_ = (undefined1)input._M_string_length;
  s.m_data = (uchar *)input._M_dataplus._M_p;
  s.m_size._1_7_ = input._M_string_length._1_7_;
  HexStr_abi_cxx11_(&hex,s);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x103;
  file_05.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  local_88.m_lhs.m_value = (unsigned_long *)hex._M_string_length;
  local_88.m_rhs = (unsigned_long *)CONCAT44(local_88.m_rhs._4_4_,0x200);
  _cVar6 = 0x58d676;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_1e0,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)&local_88,false);
  local_218 = "hex.size() == 512";
  local_210 = "";
  out_exp._M_str = (char *)((ulong)out_exp._M_str & 0xffffffffffffff00);
  out_exp._M_len = (size_t)&PTR__lazy_ostream_0113a070;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_220 = "";
  pvVar2 = (iterator)0x2;
  pvVar4 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)&out_exp,2,0xe,WARN,_cVar6,(size_t)&local_228,0x103);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  for (local_230 = 0; local_230 < 0x100; local_230 = local_230 + 1) {
    upper = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&test_method::hexmap,hex._M_dataplus._M_p[local_230 * 2],0);
    lower = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&test_method::hexmap,hex._M_dataplus._M_p[local_230 * 2 + 1],0);
    local_250 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_248 = "";
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar4;
    msg_06.m_begin = pvVar2;
    file_06.m_end = (iterator)0x108;
    file_06.m_begin = (iterator)&local_250;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_260,
               msg_06);
    local_88.m_lhs.m_value = &upper;
    local_88.m_rhs = &std::basic_string_view<char,_std::char_traits<char>_>::npos;
    _cVar6 = 0x58d7ea;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_1e0,&local_88,false);
    local_218 = "upper != std::string_view::npos";
    local_210 = "";
    out_exp._M_str = (char *)((ulong)out_exp._M_str & 0xffffffffffffff00);
    out_exp._M_len = (size_t)&PTR__lazy_ostream_0113a070;
    local_270 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_268 = "";
    pvVar2 = (iterator)0x2;
    pvVar4 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_1e0,(lazy_ostream *)&out_exp,2,0xe,WARN,_cVar6,(size_t)&local_270,0x108);
    boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_278 = "";
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = pvVar4;
    msg_07.m_begin = pvVar2;
    file_07.m_end = (iterator)0x109;
    file_07.m_begin = (iterator)&local_280;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_290,
               msg_07);
    local_88.m_lhs.m_value = &lower;
    local_88.m_rhs = &std::basic_string_view<char,_std::char_traits<char>_>::npos;
    _cVar6 = 0x58d8f0;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_1e0,&local_88,false);
    local_218 = "lower != std::string_view::npos";
    local_210 = "";
    out_exp._M_str = (char *)((ulong)out_exp._M_str & 0xffffffffffffff00);
    out_exp._M_len = (size_t)&PTR__lazy_ostream_0113a070;
    local_2a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_298 = "";
    pvVar2 = (iterator)0x2;
    pvVar4 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_1e0,(lazy_ostream *)&out_exp,2,0xe,WARN,_cVar6,(size_t)&local_2a0,0x109);
    boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
    local_2b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_08.m_end = pvVar4;
    msg_08.m_begin = pvVar2;
    file_08.m_end = (iterator)0x10a;
    file_08.m_begin = (iterator)&local_2b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c0,
               msg_08);
    local_88.m_rhs = (unsigned_long *)(upper * 0x10 + lower);
    local_88.m_lhs.m_value = &local_230;
    _cVar6 = 0x58da06;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
    ::evaluate(&local_1e0,
               (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
                *)&local_88,false);
    local_218 = "i == upper*16 + lower";
    local_210 = "";
    out_exp._M_str = (char *)((ulong)out_exp._M_str & 0xffffffffffffff00);
    out_exp._M_len = (size_t)&PTR__lazy_ostream_0113a070;
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2c8 = "";
    pvVar2 = (iterator)0x2;
    pvVar4 = (iterator)0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_1e0,(lazy_ostream *)&out_exp,2,0xe,WARN,_cVar6,(size_t)&local_2d0,0x10a);
    boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  }
  std::__cxx11::string::~string((string *)&hex);
  std::__cxx11::string::~string((string *)&input);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_HexStr)
{
    BOOST_CHECK_EQUAL(HexStr(HEX_PARSE_OUTPUT), HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.last(0)), "");
    BOOST_CHECK_EQUAL(HexStr(Span{HEX_PARSE_OUTPUT}.first(0)), "");

    {
        constexpr std::string_view out_exp{"04678afdb0"};
        constexpr std::span in_s{HEX_PARSE_OUTPUT, out_exp.size() / 2};
        const Span<const uint8_t> in_u{MakeUCharSpan(in_s)};
        const Span<const std::byte> in_b{MakeByteSpan(in_s)};

        BOOST_CHECK_EQUAL(HexStr(in_u), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_s), out_exp);
        BOOST_CHECK_EQUAL(HexStr(in_b), out_exp);
    }

    {
        auto input = std::string();
        for (size_t i=0; i<256; ++i) {
            input.push_back(static_cast<char>(i));
        }

        auto hex = HexStr(input);
        BOOST_TEST_REQUIRE(hex.size() == 512);
        static constexpr auto hexmap = std::string_view("0123456789abcdef");
        for (size_t i = 0; i < 256; ++i) {
            auto upper = hexmap.find(hex[i * 2]);
            auto lower = hexmap.find(hex[i * 2 + 1]);
            BOOST_TEST_REQUIRE(upper != std::string_view::npos);
            BOOST_TEST_REQUIRE(lower != std::string_view::npos);
            BOOST_TEST_REQUIRE(i == upper*16 + lower);
        }
    }
}